

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureBufferTests.cpp
# Opt level: O2

string * __thiscall
deqp::gles31::Functional::(anonymous_namespace)::toTestName_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,ModifyBits modifyBits)

{
  bool bVar1;
  ostream *poVar2;
  bool *pbVar3;
  long lVar4;
  ostringstream stream;
  ostringstream local_1a8 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  bVar1 = true;
  for (lVar4 = 0; lVar4 != 0x40; lVar4 = lVar4 + 0x10) {
    if ((*(uint *)((long)&DAT_00a1b2b0 + lVar4) & (uint)this) != 0) {
      pbVar3 = (bool *)0x80c1df;
      if (bVar1) {
        pbVar3 = SSBOArrayLengthTests::init::arraysSized + 1;
      }
      poVar2 = std::operator<<((ostream *)local_1a8,pbVar3);
      std::operator<<(poVar2,*(char **)((long)&PTR_anon_var_dwarf_463275_00a1b2b8 + lVar4));
      bVar1 = false;
    }
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

string toTestName (ModifyBits modifyBits)
{
	struct
	{
		ModifyBits	bit;
		const char*	str;
	} bitInfos[] =
	{
		{ MODIFYBITS_BUFFERDATA,			"bufferdata"			},
		{ MODIFYBITS_BUFFERSUBDATA,			"buffersubdata"			},
		{ MODIFYBITS_MAPBUFFER_WRITE,		"mapbuffer_write"		},
		{ MODIFYBITS_MAPBUFFER_READWRITE,	"mapbuffer_readwrite"	}
	};

	std::ostringstream	stream;
	bool				first	= true;

	DE_ASSERT(modifyBits != 0);

	for (int infoNdx = 0; infoNdx < DE_LENGTH_OF_ARRAY(bitInfos); infoNdx++)
	{
		if (modifyBits & bitInfos[infoNdx].bit)
		{
			stream << (first ? "" : "_") << bitInfos[infoNdx].str;
			first = false;
		}
	}

	return stream.str();
}